

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_CheckGatesConsistency(Ses_Man_t *pSes,int nGates)

{
  int nGates_local;
  Ses_Man_t *pSes_local;
  
  if ((pSes->nMaxDepth == -1) || (nGates < 1 << ((byte)pSes->nMaxDepth & 0x1f))) {
    if ((pSes->nMaxDepth == -1) ||
       ((pSes->pArrTimeProfile == (int *)0x0 || (nGates <= pSes->nMaxGates)))) {
      if ((pSes->fDecStructure == 0) || (nGates < (1 << ((char)pSes->nMaxDepth - 1U & 0x1f)) + 1)) {
        if (nGates < 1 << ((byte)pSes->nSpecVars & 0x1f)) {
          pSes_local._4_4_ = 1;
        }
        else {
          if (pSes->fReasonVerbose != 0) {
            printf("give up due to impossible number of gates");
          }
          pSes_local._4_4_ = 0;
        }
      }
      else {
        if (pSes->fReasonVerbose != 0) {
          printf("give up due to impossible depth in AND-dec structure (depth = %d, gates = %d)",
                 (ulong)(uint)pSes->nMaxDepth,(ulong)(uint)nGates);
        }
        pSes_local._4_4_ = 0;
      }
    }
    else {
      if (pSes->fReasonVerbose != 0) {
        printf("give up due to impossible depth and arrival times (depth = %d, gates = %d)",
               (ulong)(uint)pSes->nMaxDepth,(ulong)(uint)nGates);
      }
      pSes_local._4_4_ = 0;
    }
  }
  else {
    if (pSes->fReasonVerbose != 0) {
      printf("give up due to impossible depth (depth = %d, gates = %d)",(ulong)(uint)pSes->nMaxDepth
             ,(ulong)(uint)nGates);
    }
    pSes_local._4_4_ = 0;
  }
  return pSes_local._4_4_;
}

Assistant:

static int Ses_CheckGatesConsistency( Ses_Man_t * pSes, int nGates )
{
    /* give up if number of gates is impossible for given depth */
    if ( pSes->nMaxDepth != -1 && nGates >= ( 1 << pSes->nMaxDepth ) )
    {
        if ( pSes->fReasonVerbose )
            printf( "give up due to impossible depth (depth = %d, gates = %d)", pSes->nMaxDepth, nGates );
        return 0;
    }

    /* give up if number of gates is impossible for given depth and arrival times */
    if ( pSes->nMaxDepth != -1 && pSes->pArrTimeProfile && nGates > pSes->nMaxGates )
    {
        if ( pSes->fReasonVerbose )
            printf( "give up due to impossible depth and arrival times (depth = %d, gates = %d)", pSes->nMaxDepth, nGates );
        return 0;
    }

    if ( pSes->fDecStructure && nGates >= ( 1 << ( pSes->nMaxDepth - 1 ) ) + 1 )
    {
        if ( pSes->fReasonVerbose )
            printf( "give up due to impossible depth in AND-dec structure (depth = %d, gates = %d)", pSes->nMaxDepth, nGates );
        return 0;
    }

    /* give up if number of gates gets practically too large */
    if ( nGates >= ( 1 << pSes->nSpecVars ) )
    {
        if ( pSes->fReasonVerbose )
            printf( "give up due to impossible number of gates" );
        return 0;
    }

    return 1;
}